

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

AActor * RoughBlockCheck(AActor *mo,int index,void *param)

{
  FBlockNode *pFVar1;
  bool bVar2;
  
  pFVar1 = blocklinks[index];
  while( true ) {
    if (pFVar1 == (FBlockNode *)0x0) {
      return (AActor *)0x0;
    }
    if ((((pFVar1->Me != mo) &&
         ((*param != '\x01' || (bVar2 = AActor::CanSeek(mo,pFVar1->Me), bVar2)))) &&
        ((*(char *)((long)param + 1) != '\x01' ||
         ((*(double *)((long)param + 8) - (pFVar1->Me->__Pos).X) * *(double *)((long)param + 0x20) +
          ((pFVar1->Me->__Pos).Y - *(double *)((long)param + 0x10)) *
          *(double *)((long)param + 0x18) <= 1.52587890625e-05)))) &&
       (bVar2 = AActor::IsOkayToAttack(mo,pFVar1->Me), bVar2)) break;
    pFVar1 = pFVar1->NextActor;
  }
  return pFVar1->Me;
}

Assistant:

static AActor *RoughBlockCheck (AActor *mo, int index, void *param)
{
	BlockCheckInfo *info = (BlockCheckInfo *)param;

	FBlockNode *link;

	for (link = blocklinks[index]; link != NULL; link = link->NextActor)
	{
		if (link->Me != mo)
		{
			if (info->onlyseekable && !mo->CanSeek(link->Me))
			{
				continue;
			}
			if (info->frontonly && P_PointOnDivlineSide(link->Me->X(), link->Me->Y(), &info->frontline) != 0)
			{
				continue;
			}
			if (mo->IsOkayToAttack (link->Me))
			{
				return link->Me;
			}
		}
	}
	return NULL;
}